

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fountain.c
# Opt level: O0

void dowaterdemon(void)

{
  xchar xVar1;
  int iVar2;
  monst *mtmp_00;
  char *pcVar3;
  trap *ptVar4;
  monst *mtmp;
  
  if ((mvitals[300].mvflags & 3) == 0) {
    mtmp_00 = makemon(mons + 300,level,(int)u.ux,(int)u.uy,0);
    if (mtmp_00 != (monst *)0x0) {
      if (((u.uprops[0x1e].intrinsic == 0) &&
          (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
           (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
         ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
        pcVar3 = a_monnam(mtmp_00);
        pline("You unleash %s!",pcVar3);
      }
      else {
        pline("You feel the presence of evil.");
      }
      iVar2 = rnd(100);
      xVar1 = level_difficulty(&u.uz);
      if (xVar1 + 0x50 < iVar2) {
        iVar2 = pronoun_gender(level,mtmp_00);
        pcVar3 = genders[iVar2].his;
        iVar2 = pronoun_gender(level,mtmp_00);
        pline("Grateful for %s release, %s grants you a wish!",pcVar3,genders[iVar2].he);
        makewish('\0');
        mongone(mtmp_00);
      }
      else {
        ptVar4 = t_at(level,(int)mtmp_00->mx,(int)mtmp_00->my);
        if (ptVar4 != (trap *)0x0) {
          mintrap(mtmp_00);
        }
      }
    }
  }
  else {
    pline("The fountain bubbles furiously for a moment, then calms.");
  }
  return;
}

Assistant:

static void dowaterdemon(void) /* Water demon */
{
    struct monst *mtmp;

    if (!(mvitals[PM_WATER_DEMON].mvflags & G_GONE)) {
	if ((mtmp = makemon(&mons[PM_WATER_DEMON], level, u.ux, u.uy, NO_MM_FLAGS))) {
	    if (!Blind)
		pline("You unleash %s!", a_monnam(mtmp));
	    else
		pline("You feel the presence of evil.");

	/* Give those on low levels a (slightly) better chance of survival */
	    if (rnd(100) > (80 + level_difficulty(&u.uz))) {
		pline("Grateful for %s release, %s grants you a wish!",
		      mhis(level, mtmp), mhe(level, mtmp));
		makewish(FALSE);
		mongone(mtmp);
	    } else if (t_at(level, mtmp->mx, mtmp->my))
		mintrap(mtmp);
	}
    } else
	pline("The fountain bubbles furiously for a moment, then calms.");
}